

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void PrintBlock(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule,
               RegVmLoweredBlock *lowblock)

{
  OutputContext *pOVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  uint local_34;
  RegVmLoweredInstruction *pRStack_30;
  uint i_2;
  RegVmLoweredInstruction *lowInstruction;
  uint i_1;
  uint i;
  RegVmLoweredBlock *lowblock_local;
  RegVmLoweredModule *lowModule_local;
  InstructionRegVmLowerGraphContext *ctx_local;
  
  PrintLine(ctx->output,"%.*s.b%d:",
            (ulong)(uint)((int)(lowblock->vmBlock->name).end - (int)(lowblock->vmBlock->name).begin)
            ,(lowblock->vmBlock->name).begin,(ulong)lowblock->vmBlock->uniqueId);
  bVar2 = SmallArray<unsigned_char,_16U>::empty(&lowblock->entryRegisters);
  if (!bVar2) {
    Print(ctx->output,"  // entry registers: [");
    lowInstruction._4_4_ = 0;
    while( true ) {
      uVar3 = SmallArray<unsigned_char,_16U>::size(&lowblock->entryRegisters);
      if (uVar3 <= lowInstruction._4_4_) break;
      if (lowInstruction._4_4_ != 0) {
        Print(ctx->output,", ");
      }
      pOVar1 = ctx->output;
      pbVar4 = SmallArray<unsigned_char,_16U>::operator[]
                         (&lowblock->entryRegisters,lowInstruction._4_4_);
      Print(pOVar1,"r%d",(ulong)*pbVar4);
      lowInstruction._4_4_ = lowInstruction._4_4_ + 1;
    }
    PrintLine(ctx->output,"]");
  }
  bVar2 = SmallArray<unsigned_char,_16U>::empty(&lowblock->reservedRegisters);
  if (!bVar2) {
    Print(ctx->output,"  // reserved registers: [");
    lowInstruction._0_4_ = 0;
    while( true ) {
      uVar3 = SmallArray<unsigned_char,_16U>::size(&lowblock->reservedRegisters);
      if (uVar3 <= (uint)lowInstruction) break;
      if ((uint)lowInstruction != 0) {
        Print(ctx->output,", ");
      }
      pOVar1 = ctx->output;
      pbVar4 = SmallArray<unsigned_char,_16U>::operator[]
                         (&lowblock->reservedRegisters,(uint)lowInstruction);
      Print(pOVar1,"r%d",(ulong)*pbVar4);
      lowInstruction._0_4_ = (uint)lowInstruction + 1;
    }
    PrintLine(ctx->output,"]");
  }
  for (pRStack_30 = lowblock->firstInstruction; pRStack_30 != (RegVmLoweredInstruction *)0x0;
      pRStack_30 = pRStack_30->nextSibling) {
    PrintIndent(ctx->output);
    PrintInstruction(ctx,(char *)(lowModule->constants).data,pRStack_30);
  }
  bVar2 = SmallArray<unsigned_char,_16U>::empty(&lowblock->exitRegisters);
  if (!bVar2) {
    Print(ctx->output,"  // exit registers: [");
    local_34 = 0;
    while( true ) {
      uVar3 = SmallArray<unsigned_char,_16U>::size(&lowblock->exitRegisters);
      if (uVar3 <= local_34) break;
      if (local_34 != 0) {
        Print(ctx->output,", ");
      }
      pOVar1 = ctx->output;
      pbVar4 = SmallArray<unsigned_char,_16U>::operator[](&lowblock->exitRegisters,local_34);
      Print(pOVar1,"r%d",(ulong)*pbVar4);
      local_34 = local_34 + 1;
    }
    PrintLine(ctx->output,"]");
  }
  if (lowblock->lastInstruction != (RegVmLoweredInstruction *)0x0) {
    bVar2 = IsBlockTerminator(lowblock->lastInstruction);
    if (!bVar2) {
      PrintLine(ctx->output,"  // fallthrough");
    }
  }
  PrintLine(ctx->output);
  return;
}

Assistant:

void PrintBlock(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule, RegVmLoweredBlock *lowblock)
{
	PrintLine(ctx.output, "%.*s.b%d:", FMT_ISTR(lowblock->vmBlock->name), lowblock->vmBlock->uniqueId);

	if(!lowblock->entryRegisters.empty())
	{
		Print(ctx.output, "  // entry registers: [");

		for(unsigned i = 0; i < lowblock->entryRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->entryRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	if(!lowblock->reservedRegisters.empty())
	{
		Print(ctx.output, "  // reserved registers: [");

		for(unsigned i = 0; i < lowblock->reservedRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->reservedRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	for(RegVmLoweredInstruction *lowInstruction = lowblock->firstInstruction; lowInstruction; lowInstruction = lowInstruction->nextSibling)
	{
		PrintIndent(ctx.output);
		PrintInstruction(ctx, (char*)lowModule->constants.data, lowInstruction);
	}

	if(!lowblock->exitRegisters.empty())
	{
		Print(ctx.output, "  // exit registers: [");

		for(unsigned i = 0; i < lowblock->exitRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->exitRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	if(lowblock->lastInstruction && !IsBlockTerminator(lowblock->lastInstruction))
		PrintLine(ctx.output, "  // fallthrough");

	PrintLine(ctx.output);
}